

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

int __thiscall tf::TFProfObserver::on_exit(TFProfObserver *this,__func *__func,void *__arg)

{
  long lVar1;
  pointer psVar2;
  _Map_pointer pptVar3;
  pointer pvVar4;
  _Map_pointer pptVar5;
  _Elt_pointer ptVar6;
  _Elt_pointer ptVar7;
  _Elt_pointer ptVar8;
  _Elt_pointer ptVar9;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar10;
  reference pvVar11;
  size_type __new_size;
  value_type beg;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  TaskType local_2c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  
  lVar1 = *(long *)(__func + 8);
  psVar2 = (this->_stacks).
           super__Vector_base<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pptVar3 = *(_Map_pointer *)
             ((long)&psVar2[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x48);
  pvVar4 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = ((long)*(_Elt_pointer *)
                       ((long)&psVar2[lVar1].c.
                               super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                               ._M_impl + 0x20) -
                (long)((iterator *)
                      ((long)&psVar2[lVar1].c.
                              super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                              ._M_impl + 0x10))->_M_cur >> 3) +
               ((long)((iterator *)
                      ((long)&psVar2[lVar1].c.
                              super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                              ._M_impl + 0x30))->_M_cur -
                (long)*(_Elt_pointer *)
                       ((long)&psVar2[lVar1].c.
                               super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                               ._M_impl + 0x38) >> 3) +
               ((((ulong)((long)pptVar3 -
                         (long)*(_Map_pointer *)
                                ((long)&psVar2[lVar1].c.
                                        super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                                        ._M_impl + 0x28)) >> 3) - 1) +
               (ulong)(pptVar3 == (_Map_pointer)0x0)) * 0x40;
  if ((ulong)(((long)*(pointer *)
                      ((long)&pvVar4[lVar1].
                              super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar4[lVar1].
                         super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                         ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555) < __new_size)
  {
    std::
    vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
    ::resize(pvVar4 + lVar1,__new_size);
  }
  psVar2 = (this->_stacks).
           super__Vector_base<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar10 = ((iterator *)
            ((long)&psVar2[lVar1].c.
                    super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ._M_impl + 0x30))->_M_cur;
  if (ptVar10 ==
      *(_Elt_pointer *)
       ((long)&psVar2[lVar1].c.
               super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
               ._M_impl + 0x38)) {
    ptVar10 = psVar2[lVar1].c.
              super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_38.__d.__r = (duration)ptVar10[-1].__d.__r;
  std::
  deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ::pop_back(&psVar2[lVar1].c);
  psVar2 = (this->_stacks).
           super__Vector_base<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pptVar3 = *(_Map_pointer *)
             ((long)&psVar2[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x48);
  pptVar5 = *(_Map_pointer *)
             ((long)&psVar2[lVar1].c.
                     super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                     ._M_impl + 0x28);
  ptVar6 = ((iterator *)
           ((long)&psVar2[lVar1].c.
                   super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   ._M_impl + 0x30))->_M_cur;
  ptVar7 = *(_Elt_pointer *)
            ((long)&psVar2[lVar1].c.
                    super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ._M_impl + 0x38);
  ptVar8 = ((iterator *)
           ((long)&psVar2[lVar1].c.
                   super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   ._M_impl + 0x10))->_M_cur;
  ptVar9 = *(_Elt_pointer *)
            ((long)&psVar2[lVar1].c.
                    super__Deque_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    ._M_impl + 0x20);
  lVar1 = *(long *)&(this->_timeline).segments.
                    super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar1].
                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  local_2c = UNDEFINED;
  if ((ulong)*(byte *)((long)__arg + 0xc0) < 9) {
    local_2c = *(TaskType *)(&DAT_00126238 + (ulong)*(byte *)((long)__arg + 0xc0) * 4);
  }
  local_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  pvVar11 = std::vector<tf::Segment,std::allocator<tf::Segment>>::
            emplace_back<std::__cxx11::string_const&,tf::TaskType,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      ((vector<tf::Segment,std::allocator<tf::Segment>> *)
                       (lVar1 + ((((ulong)((long)pptVar3 - (long)pptVar5) >> 3) - 1) +
                                (ulong)(pptVar3 == (_Map_pointer)0x0)) * 0x600 +
                        ((ulong)((long)ptVar6 - (long)ptVar7) >> 3) * 0x18 +
                       ((ulong)((long)ptVar9 - (long)ptVar8) >> 3) * 0x18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)__arg + 8),&local_2c,&local_38,&local_28);
  return (int)pvVar11;
}

Assistant:

inline void TFProfObserver::on_exit(WorkerView wv, TaskView tv) {

  size_t w = wv.id();

  assert(!_stacks[w].empty());
  
  if(_stacks[w].size() > _timeline.segments[w].size()) {
    _timeline.segments[w].resize(_stacks[w].size());
  }

  auto beg = _stacks[w].top();
  _stacks[w].pop();

  _timeline.segments[w][_stacks[w].size()].emplace_back(
    tv.name(), tv.type(), beg, observer_stamp_t::clock::now()
  );
}